

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::emit_mesh_tasks(CompilerMSL *this,SPIRBlock *block)

{
  string local_70;
  string local_50;
  string local_30;
  
  CompilerGLSL::flush_variable_declaration(&this->super_CompilerGLSL,this->builtin_task_grid_id);
  CompilerGLSL::to_unpacked_expression_abi_cxx11_
            (&local_50,&this->super_CompilerGLSL,(block->mesh).groups[0].id,true);
  CompilerGLSL::to_unpacked_expression_abi_cxx11_
            (&local_70,&this->super_CompilerGLSL,(block->mesh).groups[1].id,true);
  CompilerGLSL::to_unpacked_expression_abi_cxx11_
            (&local_30,&this->super_CompilerGLSL,(block->mesh).groups[2].id,true);
  CompilerGLSL::
  statement<char_const(&)[40],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [40])"spvMgp.set_threadgroups_per_grid(uint3(",
             &local_50,(char (*) [3])0x2d38e3,&local_70,(char (*) [3])0x2d38e3,&local_30,
             (char (*) [4])0x2d0ee8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  CompilerGLSL::statement<char_const(&)[8]>(&this->super_CompilerGLSL,(char (*) [8])0x2d6fa6);
  return;
}

Assistant:

void CompilerMSL::emit_mesh_tasks(SPIRBlock &block)
{
	// GLSL: Once this instruction is called, the workgroup must be terminated immediately, and the mesh shaders are launched.
	// TODO: find relieble and clean of terminating shader.
	flush_variable_declaration(builtin_task_grid_id);
	statement("spvMgp.set_threadgroups_per_grid(uint3(", to_unpacked_expression(block.mesh.groups[0]), ", ",
	          to_unpacked_expression(block.mesh.groups[1]), ", ", to_unpacked_expression(block.mesh.groups[2]), "));");
	// This is correct if EmitMeshTasks is called in the entry function for shader.
	// Only viable solutions would be:
	// - Caller ensures the SPIR-V is inlined, then this always holds true.
	// - Pass down a "should terminate" bool to leaf functions and chain return (horrible and disgusting, let's not).
	statement("return;");
}